

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall FixedSizeCache<int>::FixedSizeCache(FixedSizeCache<int> *this,int size)

{
  int size_local;
  FixedSizeCache<int> *this_local;
  
  this->_count = 0;
  std::vector<int,_std::allocator<int>_>::vector(&this->_data);
  initialize(this,size);
  return;
}

Assistant:

FixedSizeCache(int const size = 1000) :
        _count(0)
    {
        this->initialize(size);
    }